

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  ITracker *p;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  p = (ITracker *)operator_new(0x60);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"{root}","");
  (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__SectionTracker_0017afc8;
  p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)(p + 2);
  std::__cxx11::string::_M_construct<char*>((string *)(p + 1),local_40,local_38 + (long)local_40);
  p[3].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)this;
  *(undefined8 *)&p[3].super_SharedImpl<Catch::IShared>.m_rc = 0;
  p[4].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)0x0;
  *(undefined8 *)&p[4].super_SharedImpl<Catch::IShared>.m_rc = 0;
  p[5].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)0x0;
  p[5].super_SharedImpl<Catch::IShared>.m_rc = 0;
  (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__SectionTracker_0017b3c0;
  Ptr<Catch::TestCaseTracking::ITracker>::operator=(&this->m_rootTracker,p);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).m_p;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
        m_rootTracker = new SectionTracker( "{root}", *this, CATCH_NULL );
        m_currentTracker = CATCH_NULL;
        m_runState = Executing;
        return *m_rootTracker;
    }